

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Agent.cpp
# Opt level: O0

size_t RVO::linearProgram2(vector<RVO::Line,_std::allocator<RVO::Line>_> *lines,float radius,
                          Vector2 *optVelocity,bool directionOpt,Vector2 *result)

{
  Vector2 VVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  const_reference this;
  float fVar5;
  float fVar6;
  Vector2 tempResult;
  ulong local_58;
  size_t i;
  Vector2 local_48;
  Vector2 local_40;
  Vector2 *local_38;
  Vector2 *result_local;
  Vector2 *pVStack_28;
  bool directionOpt_local;
  Vector2 *optVelocity_local;
  vector<RVO::Line,_std::allocator<RVO::Line>_> *pvStack_18;
  float radius_local;
  vector<RVO::Line,_std::allocator<RVO::Line>_> *lines_local;
  
  local_38 = result;
  result_local._7_1_ = directionOpt;
  pVStack_28 = optVelocity;
  optVelocity_local._4_4_ = radius;
  pvStack_18 = lines;
  if (directionOpt) {
    local_40 = Vector2::operator*(optVelocity,radius);
    *local_38 = local_40;
  }
  else {
    fVar6 = absSq(optVelocity);
    fVar5 = sqr(optVelocity_local._4_4_);
    if (fVar6 <= fVar5) {
      *local_38 = *pVStack_28;
    }
    else {
      i = (size_t)normalize(pVStack_28);
      local_48 = Vector2::operator*((Vector2 *)&i,optVelocity_local._4_4_);
      *local_38 = local_48;
    }
  }
  local_58 = 0;
  do {
    sVar3 = std::vector<RVO::Line,_std::allocator<RVO::Line>_>::size(pvStack_18);
    if (sVar3 <= local_58) {
      sVar3 = std::vector<RVO::Line,_std::allocator<RVO::Line>_>::size(pvStack_18);
      return sVar3;
    }
    pvVar4 = std::vector<RVO::Line,_std::allocator<RVO::Line>_>::operator[](pvStack_18,local_58);
    this = std::vector<RVO::Line,_std::allocator<RVO::Line>_>::operator[](pvStack_18,local_58);
    tempResult = Vector2::operator-(&this->point,local_38);
    fVar6 = det(&pvVar4->direction,&tempResult);
    if (0.0 < fVar6) {
      VVar1 = *local_38;
      bVar2 = linearProgram1(pvStack_18,local_58,optVelocity_local._4_4_,pVStack_28,
                             (bool)(result_local._7_1_ & 1),local_38);
      if (!bVar2) {
        *local_38 = VVar1;
        return local_58;
      }
    }
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

size_t linearProgram2(const std::vector<Line> &lines, float radius, const Vector2 &optVelocity, bool directionOpt, Vector2 &result)
	{
		if (directionOpt) {
			/*
			 * Optimize direction. Note that the optimization velocity is of unit
			 * length in this case.
			 */
			result = optVelocity * radius;
		}
		else if (absSq(optVelocity) > sqr(radius)) {
			/* Optimize closest point and outside circle. */
			result = normalize(optVelocity) * radius;
		}
		else {
			/* Optimize closest point and inside circle. */
			result = optVelocity;
		}

		for (size_t i = 0; i < lines.size(); ++i) {
			if (det(lines[i].direction, lines[i].point - result) > 0.0f) {
				/* Result does not satisfy constraint i. Compute new optimal result. */
				const Vector2 tempResult = result;

				if (!linearProgram1(lines, i, radius, optVelocity, directionOpt, result)) {
					result = tempResult;
					return i;
				}
			}
		}

		return lines.size();
	}